

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  byte bVar1;
  int iVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  Var value_00;
  bool bVar5;
  BOOL BVar6;
  PropertyOperationFlags PVar7;
  PropertyOperationFlags PVar8;
  PropertyOperationFlags PVar9;
  ulong uVar10;
  uint32 local_54;
  Var pvStack_50;
  uint32 indexVal;
  ulong local_48;
  byte *local_40;
  ScriptContext *local_38;
  
  uVar10 = (ulong)flags;
  local_38 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  pvStack_50 = value;
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar5)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar3 = local_38->threadContext;
    (pTVar3->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar3->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  iVar2 = this->propertyCount;
  bVar5 = 0 < iVar2;
  PVar9 = flags;
  if (0 < iVar2) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      bVar5 = true;
      PVar9 = PropertyOperation_None;
    }
    else {
      PVar7 = PropertyOperation_StrictMode;
      do {
        PVar8 = PVar7 & 0xffff;
        bVar5 = (int)PVar8 < iVar2;
        PVar9 = PVar7;
        if (iVar2 <= (int)PVar8) break;
        PVar7 = PVar8 + PropertyOperation_StrictMode;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(PVar8 << 4)) + 8) !=
               propertyId);
    }
  }
  local_48 = uVar10;
  if (bVar5) {
    local_40 = (byte *)((long)&this->descriptors[0].field_1 + (ulong)((PVar9 & 0xffff) << 4));
    if ((*local_40 & 8) == 0) {
      if ((*local_40 & 4) == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode(flags,local_38);
        if (info == (PropertyValueInfo *)0x0) {
          return 0;
        }
        bVar1 = *local_40;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = (PropertyIndex)PVar9;
        info->m_attributes = bVar1;
        info->flags = InlineCacheNoFlags;
        return 0;
      }
    }
    else {
      if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (ScriptContext *)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)&(local_38->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x23a,"(!GetIsLocked())","!GetIsLocked()");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *(undefined4 *)&(local_38->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
      }
      *local_40 = 7;
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    value_00 = pvStack_50;
    DynamicTypeHandler::SetSlotUnchecked(instance,PVar9 & 0xffff,pvStack_50);
    if (info != (PropertyValueInfo *)0x0) {
      bVar1 = *local_40;
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = (PropertyIndex)PVar9;
      info->m_attributes = bVar1;
      info->flags = InlineCacheNoFlags;
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,value_00,SideEffects_Any);
    BVar6 = 1;
  }
  else {
    BVar6 = ScriptContext::IsNumericPropertyId(local_38,propertyId,&local_54);
    if (BVar6 == 0) {
      BVar6 = AddProperty(this,instance,propertyId,pvStack_50,'\a',info,
                          (PropertyOperationFlags)local_48,SideEffects_Any);
    }
    else {
      BVar6 = DynamicTypeHandler::SetItem
                        (&this->super_DynamicTypeHandler,instance,local_54,pvStack_50,
                         (PropertyOperationFlags)local_48);
    }
  }
  return BVar6;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                descriptors[index].Attributes = PropertyDynamicTypeDefaults;
                instance->SetHasNoEnumerableProperties(false);
            }
            else if (!(descriptors[index].Attributes & PropertyWritable))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes); // Try to cache property info even if not writable
                return false;
            }

            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
            return true;
        }

        // Always check numeric propertyId. This may create objectArray.
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItem(instance, indexVal, value, flags);
        }

        return this->AddProperty(instance, propertyId, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }